

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cc
# Opt level: O1

Value * __thiscall flow::IRBuilder::createNCmpEQ(IRBuilder *this,Value *lhs,Value *rhs,string *name)

{
  long lVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  Value *local_50;
  Value *local_48;
  string local_40;
  
  local_50 = rhs;
  local_48 = lhs;
  if (lhs->type_ != rhs->type_) {
    __assert_fail("lhs->type() == rhs->type()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRBuilder.cc"
                  ,0x135,
                  "Value *flow::IRBuilder::createNCmpEQ(Value *, Value *, const std::string &)");
  }
  if (lhs->type_ == Number) {
    if (lhs == (Value *)0x0) {
      lVar1 = 0;
    }
    else {
      lVar1 = __dynamic_cast(lhs,&Value::typeinfo,
                             &ConstantValue<long,(flow::LiteralType)2>::typeinfo,0);
    }
    if (lVar1 == 0) {
      bVar4 = true;
    }
    else {
      if (rhs == (Value *)0x0) {
        lVar2 = 0;
      }
      else {
        lVar2 = __dynamic_cast(rhs,&Value::typeinfo,
                               &ConstantValue<long,(flow::LiteralType)2>::typeinfo,0);
      }
      bVar4 = lVar2 == 0;
      if (!bVar4) {
        lVar3 = 0x68;
        if (*(long *)(lVar1 + 0x48) == *(long *)(lVar2 + 0x48)) {
          lVar3 = 0x18;
        }
        rhs = (Value *)((long)&(this->program_->modules_).
                               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar3);
      }
    }
    if (bVar4) {
      makeName(&local_40,this,name);
      rhs = (Value *)insert<flow::BinaryInstr<(flow::BinaryOperator)11,(flow::LiteralType)1>,flow::Value*&,flow::Value*&,std::__cxx11::string>
                               (this,&local_48,&local_50,&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
    }
    return (Value *)(BinaryInstr<(flow::BinaryOperator)11,_(flow::LiteralType)1> *)rhs;
  }
  __assert_fail("lhs->type() == LiteralType::Number",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRBuilder.cc"
                ,0x136,"Value *flow::IRBuilder::createNCmpEQ(Value *, Value *, const std::string &)"
               );
}

Assistant:

Value* IRBuilder::createNCmpEQ(Value* lhs, Value* rhs,
                               const std::string& name) {
  assert(lhs->type() == rhs->type());
  assert(lhs->type() == LiteralType::Number);

  if (auto a = dynamic_cast<ConstantInt*>(lhs))
    if (auto b = dynamic_cast<ConstantInt*>(rhs))
      return getBoolean(a->get() == b->get());

  return insert<ICmpEQInstr>(lhs, rhs, makeName(name));
}